

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall
CConsole::RegisterTemp(CConsole *this,char *pName,char *pParams,int Flags,char *pHelp)

{
  CHeap *this_00;
  CCommand *pCommand;
  char *pcVar1;
  
  pCommand = this->m_pRecycleList;
  if (pCommand == (CCommand *)0x0) {
    this_00 = &this->m_TempCommands;
    pCommand = (CCommand *)CHeap::Allocate(this_00,0x48);
    (pCommand->super_CCommandInfo).m_AccessLevel = 0;
    (pCommand->super_CCommandInfo)._vptr_CCommandInfo = (_func_int **)&PTR__CCommandInfo_002136e8;
    pcVar1 = (char *)CHeap::Allocate(this_00,0x30);
    str_copy(pcVar1,pName,0x30);
    (pCommand->super_CCommandInfo).m_pName = pcVar1;
    pcVar1 = (char *)CHeap::Allocate(this_00,0x80);
    str_copy(pcVar1,pHelp,0x80);
    (pCommand->super_CCommandInfo).m_pHelp = pcVar1;
    pcVar1 = (char *)CHeap::Allocate(this_00,0x60);
    str_copy(pcVar1,pParams,0x60);
    (pCommand->super_CCommandInfo).m_pParams = pcVar1;
  }
  else {
    str_copy((pCommand->super_CCommandInfo).m_pName,pName,0x30);
    str_copy((pCommand->super_CCommandInfo).m_pHelp,pHelp,0x80);
    str_copy((pCommand->super_CCommandInfo).m_pParams,pParams,0x60);
    this->m_pRecycleList = this->m_pRecycleList->m_pNext;
  }
  pCommand->m_pfnCallback = (FCommandCallback)0x0;
  pCommand->m_pUserData = (void *)0x0;
  pCommand->m_Flags = Flags;
  pCommand->m_Temp = true;
  AddCommandSorted(this,pCommand);
  return;
}

Assistant:

void CConsole::RegisterTemp(const char *pName, const char *pParams,	int Flags, const char *pHelp)
{
	CCommand *pCommand;
	if(m_pRecycleList)
	{
		pCommand = m_pRecycleList;
		str_copy(const_cast<char *>(pCommand->m_pName), pName, TEMPCMD_NAME_LENGTH);
		str_copy(const_cast<char *>(pCommand->m_pHelp), pHelp, TEMPCMD_HELP_LENGTH);
		str_copy(const_cast<char *>(pCommand->m_pParams), pParams, TEMPCMD_PARAMS_LENGTH);

		m_pRecycleList = m_pRecycleList->m_pNext;
	}
	else
	{
		pCommand = new(m_TempCommands.Allocate(sizeof(CCommand))) CCommand(false);
		char *pMem = static_cast<char *>(m_TempCommands.Allocate(TEMPCMD_NAME_LENGTH));
		str_copy(pMem, pName, TEMPCMD_NAME_LENGTH);
		pCommand->m_pName = pMem;
		pMem = static_cast<char *>(m_TempCommands.Allocate(TEMPCMD_HELP_LENGTH));
		str_copy(pMem, pHelp, TEMPCMD_HELP_LENGTH);
		pCommand->m_pHelp = pMem;
		pMem = static_cast<char *>(m_TempCommands.Allocate(TEMPCMD_PARAMS_LENGTH));
		str_copy(pMem, pParams, TEMPCMD_PARAMS_LENGTH);
		pCommand->m_pParams = pMem;
	}

	pCommand->m_pfnCallback = 0;
	pCommand->m_pUserData = 0;
	pCommand->m_Flags = Flags;
	pCommand->m_Temp = true;

	AddCommandSorted(pCommand);
}